

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Array<unsigned_char> * __thiscall
kj::Vector<unsigned_char>::releaseAsArray
          (Array<unsigned_char> *__return_storage_ptr__,Vector<unsigned_char> *this)

{
  uchar *puVar1;
  ArrayDisposer *pAVar2;
  RemoveConst<unsigned_char> *pRVar3;
  
  pRVar3 = (this->builder).pos;
  if (pRVar3 != (this->builder).endPtr) {
    setCapacity(this,(long)pRVar3 - (long)(this->builder).ptr);
    pRVar3 = (this->builder).pos;
  }
  puVar1 = (this->builder).ptr;
  pAVar2 = (this->builder).disposer;
  __return_storage_ptr__->ptr = puVar1;
  __return_storage_ptr__->size_ = (long)pRVar3 - (long)puVar1;
  __return_storage_ptr__->disposer = pAVar2;
  (this->builder).ptr = (uchar *)0x0;
  (this->builder).pos = (RemoveConst<unsigned_char> *)0x0;
  (this->builder).endPtr = (uchar *)0x0;
  return __return_storage_ptr__;
}

Assistant:

inline Array<T> releaseAsArray() {
    // TODO(perf):  Avoid a copy/move by allowing Array<T> to point to incomplete space?
    if (!builder.isFull()) {
      setCapacity(size());
    }
    return builder.finish();
  }